

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  _Rb_tree_header *p_Var1;
  FieldDescriptor *this_00;
  byte bVar2;
  Descriptor *pDVar3;
  long lVar4;
  once_flag *poVar5;
  bool bVar6;
  bool bVar7;
  FileOptions_OptimizeMode FVar8;
  MessageAnalysis MVar9;
  _Base_ptr p_Var10;
  Descriptor *descriptor;
  SCC *scc_00;
  pointer ppDVar11;
  MessageAnalysis *pMVar12;
  bool bVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  bool local_78;
  SCC *local_60;
  FieldDescriptor *local_58;
  _func_void_FieldDescriptor_ptr *local_50;
  map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *local_48;
  Options *local_40;
  ulong local_38;
  
  local_48 = &this->analysis_cache_;
  p_Var10 = (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_60 = scc;
  if (p_Var10 != (_Base_ptr)0x0) {
    p_Var1 = &(this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header;
    p_Var14 = &p_Var1->_M_header;
    do {
      if (*(SCC **)(p_Var10 + 1) >= scc) {
        p_Var14 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(SCC **)(p_Var10 + 1) < scc];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var14 != p_Var1) && (*(SCC **)(p_Var14 + 1) <= scc)) {
      pMVar12 = std::
                map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                ::operator[](local_48,&local_60);
      goto LAB_0023e4f0;
    }
  }
  if ((this->options_).lite_implicit_weak_fields == true) {
    FVar8 = GetOptimizeFor(*(FileDescriptor **)
                            (*(scc->descriptors).
                              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x10),&this->options_,
                           (bool *)0x0);
    bVar18 = FVar8 == FileOptions_OptimizeMode_LITE_RUNTIME;
  }
  else {
    bVar18 = false;
  }
  ppDVar11 = (scc->descriptors).
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((scc->descriptors).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppDVar11) {
    local_78 = false;
    bVar7 = false;
    bVar13 = false;
    bVar6 = false;
  }
  else {
    uVar15 = 0;
    bVar6 = false;
    bVar13 = false;
    bVar7 = false;
    local_78 = false;
    local_40 = &this->options_;
    do {
      pDVar3 = ppDVar11[uVar15];
      if (0 < *(int *)(pDVar3 + 0x78)) {
        bVar13 = true;
      }
      if (0 < *(int *)(pDVar3 + 4)) {
        lVar16 = 0;
        lVar17 = 0;
        local_38 = uVar15;
        do {
          lVar4 = *(long *)(pDVar3 + 0x28);
          this_00 = (FieldDescriptor *)(lVar4 + lVar16);
          if ((*(byte *)(lVar4 + 1 + lVar16) & 0x60) == 0x40) {
            bVar6 = true;
          }
          if (*(char *)(*(long *)(lVar4 + 0x38 + lVar16) + 0x4f) != '\0') {
            bVar18 = true;
          }
          poVar5 = *(once_flag **)(lVar4 + 0x18 + lVar16);
          if (poVar5 != (once_flag *)0x0) {
            local_50 = FieldDescriptor::TypeOnceInit;
            local_58 = this_00;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar5,&local_50,&local_58);
          }
          bVar2 = *(byte *)(lVar4 + 2 + lVar16);
          if (bVar2 - 10 < 2) {
            descriptor = FieldDescriptor::message_type(this_00);
            scc_00 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>
                     ::GetSCC(&this->analyzer_,descriptor);
            if (scc_00 == local_60) {
              local_78 = true;
            }
            else {
              MVar9 = GetSCCAnalysis(this,scc_00);
              if ((*(char *)(*(long *)(lVar4 + 0x38 + lVar16) + 0x4d) == '\x01') &&
                 ((~*(byte *)(lVar4 + 1 + lVar16) & 0x60) != 0)) {
                poVar5 = *(once_flag **)(lVar4 + 0x18 + lVar16);
                if (poVar5 != (once_flag *)0x0) {
                  local_50 = FieldDescriptor::TypeOnceInit;
                  local_58 = this_00;
                  std::
                  call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                            (poVar5,&local_50,&local_58);
                }
                if (((*(char *)(lVar4 + 2 + lVar16) != '\v') ||
                    (FVar8 = GetOptimizeFor(*(FileDescriptor **)(lVar4 + 0x10 + lVar16),local_40,
                                            (bool *)0x0),
                    FVar8 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
                   (((this->options_).opensource_runtime & 1U) != 0)) goto LAB_0023e41b;
              }
              else {
LAB_0023e41b:
                bVar6 = (bool)(MVar9.contains_required & 1U | bVar6);
              }
              bVar7 = (bool)(MVar9.contains_cord & 1U | bVar7);
              bVar13 = (bool)(MVar9.contains_extension & 1U | bVar13);
              bVar18 = (bool)(MVar9.contains_weak & 1U | bVar18);
            }
          }
          else if (((bVar2 == 0xc) || (bVar2 == 9)) &&
                  (*(int *)(*(long *)(lVar4 + 0x38 + lVar16) + 0x48) == 1)) {
            bVar7 = true;
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x48;
        } while (lVar17 < *(int *)(pDVar3 + 4));
        ppDVar11 = (local_60->descriptors).
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        scc = local_60;
        uVar15 = local_38;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(scc->descriptors).
                                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar11 >> 3
                             ));
  }
  pMVar12 = std::
            map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
            ::operator[](local_48,&local_60);
  pMVar12->is_recursive = local_78;
  pMVar12->contains_cord = bVar7;
  pMVar12->contains_extension = bVar13;
  pMVar12->contains_required = bVar6;
  pMVar12->contains_weak = bVar18;
LAB_0023e4f0:
  return *pMVar12;
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  if (analysis_cache_.count(scc)) return analysis_cache_[scc];
  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (int i = 0; i < scc->descriptors.size(); i++) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->options().ctype() == FieldOptions::CORD) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = result;
}